

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_exp.c
# Opt level: O0

int MOD_EXP_CTIME_COPY_FROM_PREBUF(BIGNUM *b,int top,uchar *buf,int idx,int window)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BIGNUM *pBVar8;
  ulong uVar9;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  unsigned_long acc_1;
  unsigned_long y3;
  unsigned_long y2;
  unsigned_long y1;
  unsigned_long y0;
  int xstride;
  unsigned_long acc;
  unsigned_long *table;
  int width;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffff78;
  BIGNUM *in_stack_ffffffffffffff80;
  ulong local_78;
  ulong local_48;
  long local_40;
  int local_30;
  int local_2c;
  int local_4;
  
  iVar1 = 1 << ((byte)in_R8D & 0x1f);
  pBVar8 = bn_wexpand(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  if (pBVar8 == (BIGNUM *)0x0) {
    local_4 = 0;
  }
  else {
    local_40 = in_RDX;
    if (in_R8D < 4) {
      for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
        local_48 = 0;
        for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
          uVar9 = *(ulong *)(local_40 + (long)local_30 * 8);
          uVar2 = constant_time_eq_int(0,0x2237d7);
          local_48 = uVar9 & -(ulong)(uVar2 & 1) | local_48;
        }
        *(ulong *)(*in_RDI + (long)local_2c * 8) = local_48;
        local_40 = local_40 + (long)iVar1 * 8;
      }
    }
    else {
      iVar3 = 1 << ((byte)in_R8D - 2 & 0x1f);
      uVar2 = constant_time_eq_int(0,0x223884);
      uVar4 = constant_time_eq_int(0,0x2238a3);
      uVar5 = constant_time_eq_int(0,0x2238c2);
      uVar6 = constant_time_eq_int(0,0x2238e1);
      for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
        local_78 = 0;
        for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
          uVar9 = *(ulong *)(local_40 + (long)local_30 * 8) & -(ulong)(uVar2 & 1) |
                  *(ulong *)(local_40 + (long)(local_30 + iVar3) * 8) & -(ulong)(uVar4 & 1) |
                  *(ulong *)(local_40 + (long)(local_30 + iVar3 * 2) * 8) & -(ulong)(uVar5 & 1) |
                  *(ulong *)(local_40 + (long)(local_30 + iVar3 * 3) * 8) & -(ulong)(uVar6 & 1);
          uVar7 = constant_time_eq_int(0,0x2239b4);
          local_78 = uVar9 & -(ulong)(uVar7 & 1) | local_78;
        }
        *(ulong *)(*in_RDI + (long)local_2c * 8) = local_78;
        local_40 = local_40 + (long)iVar1 * 8;
      }
    }
    *(int *)(in_RDI + 1) = in_ESI;
    *(undefined4 *)((long)in_RDI + 0x14) = *(undefined4 *)((long)in_RDI + 0x14);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int MOD_EXP_CTIME_COPY_FROM_PREBUF(BIGNUM *b, int top,
                                          unsigned char *buf, int idx,
                                          int window)
{
    int i, j;
    int width = 1 << window;
    /*
     * We declare table 'volatile' in order to discourage compiler
     * from reordering loads from the table. Concern is that if
     * reordered in specific manner loads might give away the
     * information we are trying to conceal. Some would argue that
     * compiler can reorder them anyway, but it can as well be
     * argued that doing so would be violation of standard...
     */
    volatile BN_ULONG *table = (volatile BN_ULONG *)buf;

    if (bn_wexpand(b, top) == NULL)
        return 0;

    if (window <= 3) {
        for (i = 0; i < top; i++, table += width) {
            BN_ULONG acc = 0;

            for (j = 0; j < width; j++) {
                acc |= table[j] &
                       ((BN_ULONG)0 - (constant_time_eq_int(j,idx)&1));
            }

            b->d[i] = acc;
        }
    } else {
        int xstride = 1 << (window - 2);
        BN_ULONG y0, y1, y2, y3;

        i = idx >> (window - 2);        /* equivalent of idx / xstride */
        idx &= xstride - 1;             /* equivalent of idx % xstride */

        y0 = (BN_ULONG)0 - (constant_time_eq_int(i,0)&1);
        y1 = (BN_ULONG)0 - (constant_time_eq_int(i,1)&1);
        y2 = (BN_ULONG)0 - (constant_time_eq_int(i,2)&1);
        y3 = (BN_ULONG)0 - (constant_time_eq_int(i,3)&1);

        for (i = 0; i < top; i++, table += width) {
            BN_ULONG acc = 0;

            for (j = 0; j < xstride; j++) {
                acc |= ( (table[j + 0 * xstride] & y0) |
                         (table[j + 1 * xstride] & y1) |
                         (table[j + 2 * xstride] & y2) |
                         (table[j + 3 * xstride] & y3) )
                       & ((BN_ULONG)0 - (constant_time_eq_int(j,idx)&1));
            }

            b->d[i] = acc;
        }
    }

    b->top = top;
    b->flags |= BN_FLG_FIXED_TOP;
    return 1;
}